

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxbounds.hpp
# Opt level: O2

void __thiscall
soplex::SPxSolverBase<double>::setLeaveBound4Col(SPxSolverBase<double> *this,int i,int n)

{
  double *pdVar1;
  long lVar2;
  double dVar3;
  
  switch((this->super_SPxBasisBase<double>).thedesc.colstat.data[n]) {
  case P_FIXED:
    pdVar1 = (double *)infinity();
    (this->theLBbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[i] = -*pdVar1;
    break;
  default:
    (this->theUBbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[i] =
         (this->super_SPxLPBase<double>).super_LPColSetBase<double>.up.val.
         super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
         _M_start[n];
    dVar3 = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.low.val.
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start[n];
    goto LAB_001d5256;
  case P_ON_LOWER:
    pdVar1 = (double *)infinity();
    (this->theLBbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[i] = -*pdVar1;
    dVar3 = 0.0;
    goto LAB_001d5213;
  case P_ON_UPPER:
    (this->theLBbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[i] = 0.0;
    break;
  case P_FREE:
    (this->theUBbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[i] = 0.0;
    dVar3 = 0.0;
LAB_001d5256:
    lVar2 = 0x688;
    goto LAB_001d525b;
  }
  pdVar1 = (double *)infinity();
  dVar3 = *pdVar1;
LAB_001d5213:
  lVar2 = 0x670;
LAB_001d525b:
  *(double *)
   (*(long *)((long)&(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.
                     super_SVSetBase<double>.super_ClassArray<soplex::Nonzero<double>_>.
                     _vptr_ClassArray + lVar2) + (long)i * 8) = dVar3;
  return;
}

Assistant:

void SPxSolverBase<R>::setLeaveBound4Col(int i, int n)
{

   assert(this->baseId(i).isSPxColId());
   assert(this->number(SPxColId(this->baseId(i))) == n);

   switch(this->desc().colStatus(n))
   {
   case SPxBasisBase<R>::Desc::P_ON_LOWER :
      theLBbound[i] = R(-infinity);
      theUBbound[i] = 0;
      break;

   case SPxBasisBase<R>::Desc::P_ON_UPPER :
      theLBbound[i] = 0;
      theUBbound[i] = R(infinity);
      break;

   case SPxBasisBase<R>::Desc::P_FIXED :
      theLBbound[i] = R(-infinity);
      theUBbound[i] = R(infinity);
      break;

   case SPxBasisBase<R>::Desc::P_FREE :
      theLBbound[i] = theUBbound[i] = 0;
      break;

   default:
      theUBbound[i] = SPxLPBase<R>::upper(n);
      theLBbound[i] = SPxLPBase<R>::lower(n);
      break;
   }
}